

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result.hpp
# Opt level: O0

result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t> *
__thiscall
toml::result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
::operator=(result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
            *this,failure_type *f)

{
  failure_type *tmp;
  failure_type *f_local;
  result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
  *this_local;
  
  cleanup(this,(EVP_PKEY_CTX *)f);
  this->is_ok_ = false;
  *(failure_type *)&this->field_1 = *f;
  return this;
}

Assistant:

result& operator=(failure_type&& f)
    {
        this->cleanup();
        this->is_ok_ = false;
        auto tmp = ::new(std::addressof(this->fail)) failure_type(std::move(f));
        assert(tmp == std::addressof(this->fail));
        (void)tmp;
        return *this;
    }